

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

void ITransformOne(uint8_t *ref,int16_t *in,uint8_t *dst)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int aiStack_58 [4];
  int C [16];
  
  for (lVar1 = 0; (int)lVar1 != 8; lVar1 = lVar1 + 2) {
    iVar3 = (int)*(short *)((long)in + lVar1 + 0x10);
    iVar6 = iVar3 + *(short *)((long)in + lVar1);
    iVar3 = *(short *)((long)in + lVar1) - iVar3;
    iVar4 = (int)*(short *)((long)in + lVar1 + 8);
    iVar7 = (int)*(short *)((long)in + lVar1 + 0x18);
    iVar5 = (iVar4 * 0x8a8c >> 0x10) - ((iVar7 * 0x4e7b >> 0x10) + iVar7);
    iVar4 = (iVar7 * 0x8a8c >> 0x10) + (iVar4 * 0x4e7b >> 0x10) + iVar4;
    aiStack_58[lVar1 * 2] = iVar4 + iVar6;
    aiStack_58[lVar1 * 2 + 1] = iVar5 + iVar3;
    aiStack_58[lVar1 * 2 + 2] = iVar3 - iVar5;
    C[lVar1 * 2 + -1] = iVar6 - iVar4;
  }
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 4) {
    iVar6 = *(int *)((long)C + lVar1);
    iVar3 = *(int *)((long)C + lVar1 + 0x10);
    iVar5 = *(int *)((long)aiStack_58 + lVar1) + iVar3 + 4;
    iVar4 = *(int *)((long)C + lVar1 + 0x20);
    iVar2 = (iVar4 * 0x8a8c >> 0x10) + (iVar6 * 0x4e7b >> 0x10) + iVar6;
    iVar7 = (iVar2 + iVar5 >> 3) + (uint)ref[lVar1 * 8];
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    if (0xfe < iVar7) {
      iVar7 = 0xff;
    }
    iVar3 = (*(int *)((long)aiStack_58 + lVar1) + 4) - iVar3;
    iVar4 = (iVar6 * 0x8a8c >> 0x10) - ((iVar4 * 0x4e7b >> 0x10) + iVar4);
    dst[lVar1 * 8] = (uint8_t)iVar7;
    iVar6 = (iVar4 + iVar3 >> 3) + (uint)ref[lVar1 * 8 + 1];
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    dst[lVar1 * 8 + 1] = (uint8_t)iVar6;
    iVar6 = (iVar3 - iVar4 >> 3) + (uint)ref[lVar1 * 8 + 2];
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    dst[lVar1 * 8 + 2] = (uint8_t)iVar6;
    iVar6 = (iVar5 - iVar2 >> 3) + (uint)ref[lVar1 * 8 + 3];
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    dst[lVar1 * 8 + 3] = (uint8_t)iVar6;
  }
  return;
}

Assistant:

static WEBP_INLINE void ITransformOne(const uint8_t* WEBP_RESTRICT ref,
                                      const int16_t* WEBP_RESTRICT in,
                                      uint8_t* WEBP_RESTRICT dst) {
  int C[4 * 4], *tmp;
  int i;
  tmp = C;
  for (i = 0; i < 4; ++i) {    // vertical pass
    const int a = in[0] + in[8];
    const int b = in[0] - in[8];
    const int c =
        WEBP_TRANSFORM_AC3_MUL2(in[4]) - WEBP_TRANSFORM_AC3_MUL1(in[12]);
    const int d =
        WEBP_TRANSFORM_AC3_MUL1(in[4]) + WEBP_TRANSFORM_AC3_MUL2(in[12]);
    tmp[0] = a + d;
    tmp[1] = b + c;
    tmp[2] = b - c;
    tmp[3] = a - d;
    tmp += 4;
    in++;
  }

  tmp = C;
  for (i = 0; i < 4; ++i) {    // horizontal pass
    const int dc = tmp[0] + 4;
    const int a = dc + tmp[8];
    const int b = dc - tmp[8];
    const int c =
        WEBP_TRANSFORM_AC3_MUL2(tmp[4]) - WEBP_TRANSFORM_AC3_MUL1(tmp[12]);
    const int d =
        WEBP_TRANSFORM_AC3_MUL1(tmp[4]) + WEBP_TRANSFORM_AC3_MUL2(tmp[12]);
    STORE(0, i, a + d);
    STORE(1, i, b + c);
    STORE(2, i, b - c);
    STORE(3, i, a - d);
    tmp++;
  }
}